

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Vector::ContainsMatcher<int,std::allocator<int>,std::allocator<int>>::
describe_abi_cxx11_(string *__return_storage_ptr__,
                   ContainsMatcher<int,std::allocator<int>,std::allocator<int>> *this)

{
  vector<int,_std::allocator<int>_> *in_RDX;
  string local_38;
  ContainsMatcher<int,std::allocator<int>,std::allocator<int>> *local_18;
  ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *this_local;
  
  local_18 = this;
  this_local = (ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *)
               __return_storage_ptr__;
  Detail::stringify<std::vector<int,std::allocator<int>>>
            (&local_38,*(Detail **)(this + 0x30),in_RDX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"Contains: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const override {
                return "Contains: " + ::Catch::Detail::stringify( m_comparator );
            }